

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

TilePipelineStateCreateInfoX * __thiscall
Diligent::TilePipelineStateCreateInfoX::Clear(TilePipelineStateCreateInfoX *this)

{
  TilePipelineStateCreateInfoX CleanDesc;
  PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  local_190;
  
  PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  ::PipelineStateCreateInfoX(&local_190);
  std::swap<Diligent::TilePipelineStateCreateInfoX>(this,(TilePipelineStateCreateInfoX *)&local_190)
  ;
  PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  ::~PipelineStateCreateInfoX(&local_190);
  return this;
}

Assistant:

TilePipelineStateCreateInfoX& Clear()
    {
        TilePipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }